

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void Imf_2_5::anon_unknown_6::writeTileData
               (OutputStreamMutex *streamData,Data *ofd,int dx,int dy,int lx,int ly,char *pixelData,
               int pixelDataSize)

{
  int iVar1;
  undefined4 extraout_var;
  Int64 *pIVar3;
  int local_3c;
  int local_38;
  int local_34;
  Int64 IVar2;
  
  IVar2 = streamData->currentPosition;
  streamData->currentPosition = 0;
  if (IVar2 == 0) {
    iVar1 = (*streamData->os->_vptr_OStream[3])();
    IVar2 = CONCAT44(extraout_var,iVar1);
  }
  local_38 = lx;
  local_34 = ly;
  pIVar3 = TileOffsets::operator()(&ofd->tileOffsets,dx,dy,lx,ly);
  *pIVar3 = IVar2;
  if (ofd->multipart == true) {
    local_3c = ofd->partNumber;
    (*streamData->os->_vptr_OStream[2])(streamData->os,&local_3c,4);
  }
  local_3c = dx;
  (*streamData->os->_vptr_OStream[2])(streamData->os,&local_3c,4);
  local_3c = dy;
  (*streamData->os->_vptr_OStream[2])(streamData->os,&local_3c,4);
  local_3c = local_38;
  (*streamData->os->_vptr_OStream[2])(streamData->os,&local_3c,4);
  local_3c = local_34;
  (*streamData->os->_vptr_OStream[2])(streamData->os,&local_3c,4);
  local_3c = pixelDataSize;
  (*streamData->os->_vptr_OStream[2])(streamData->os,&local_3c,4);
  (*streamData->os->_vptr_OStream[2])(streamData->os,pixelData,(ulong)(uint)pixelDataSize);
  streamData->currentPosition = (long)pixelDataSize + IVar2 + 0x14;
  if (ofd->multipart == true) {
    streamData->currentPosition = (long)pixelDataSize + IVar2 + 0x18;
  }
  return;
}

Assistant:

void
writeTileData (OutputStreamMutex *streamData,
               TiledOutputFile::Data *ofd,
               int dx, int dy,
	       int lx, int ly, 
               const char pixelData[],
               int pixelDataSize)
{
    //
    // Store a block of pixel data in the output file, and try
    // to keep track of the current writing position the file,
    // without calling tellp() (tellp() can be fairly expensive).
    //

    Int64 currentPosition = streamData->currentPosition;
    streamData->currentPosition = 0;

    if (currentPosition == 0)
        currentPosition = streamData->os->tellp();

    ofd->tileOffsets (dx, dy, lx, ly) = currentPosition;

    #ifdef DEBUG
	assert (streamData->os->tellp() == currentPosition);
    #endif

    //
    // Write the tile header.
    //

    if (ofd->multipart)
    {
        Xdr::write <StreamIO> (*streamData->os, ofd->partNumber);
    }
    Xdr::write <StreamIO> (*streamData->os, dx);
    Xdr::write <StreamIO> (*streamData->os, dy);
    Xdr::write <StreamIO> (*streamData->os, lx);
    Xdr::write <StreamIO> (*streamData->os, ly);
    Xdr::write <StreamIO> (*streamData->os, pixelDataSize);

    streamData->os->write (pixelData, pixelDataSize);

    //
    // Keep current position in the file so that we can avoid 
    // redundant seekg() operations (seekg() can be fairly expensive).
    //

    streamData->currentPosition = currentPosition +
                           5 * Xdr::size<int>() +
                           pixelDataSize;

    if (ofd->multipart)
    {
        streamData->currentPosition += Xdr::size<int>();
    }
}